

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  bool bVar1;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_ge_storage s;
  secp256k1_ge p;
  secp256k1_gej pj;
  int local_15c;
  secp256k1_scalar local_158;
  secp256k1_ge_storage local_138;
  secp256k1_ge local_f8;
  secp256k1_gej local_a4;
  
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
    bVar1 = false;
  }
  else {
    secp256k1_scalar_set_b32(&local_158,seckey,&local_15c);
    bVar1 = (((local_158.d[7] != 0 || local_158.d[3] != 0) ||
             (local_158.d[5] != 0 || local_158.d[1] != 0)) ||
            ((local_158.d[6] != 0 || local_158.d[2] != 0) ||
            (local_158.d[4] != 0 || local_158.d[0] != 0))) && local_15c == 0;
    if ((((local_158.d[7] != 0 || local_158.d[3] != 0) ||
         (local_158.d[5] != 0 || local_158.d[1] != 0)) ||
        ((local_158.d[6] != 0 || local_158.d[2] != 0) ||
        (local_158.d[4] != 0 || local_158.d[0] != 0))) && local_15c == 0) {
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_a4,&local_158);
      secp256k1_ge_set_gej(&local_f8,&local_a4);
      secp256k1_ge_to_storage(&local_138,&local_f8);
      *(undefined8 *)(pubkey->data + 0x30) = local_138.y.n._16_8_;
      *(undefined8 *)(pubkey->data + 0x38) = local_138.y.n._24_8_;
      *(undefined8 *)(pubkey->data + 0x20) = local_138.y.n._0_8_;
      *(undefined8 *)(pubkey->data + 0x28) = local_138.y.n._8_8_;
      *(undefined8 *)(pubkey->data + 0x10) = local_138.x.n._16_8_;
      *(undefined8 *)(pubkey->data + 0x18) = local_138.x.n._24_8_;
      *(undefined8 *)pubkey->data = local_138.x.n._0_8_;
      *(undefined8 *)(pubkey->data + 8) = local_138.x.n._8_8_;
    }
  }
  return (int)bVar1;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_gej pj;
    secp256k1_ge p;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = (!overflow) & (!secp256k1_scalar_is_zero(&sec));
    if (ret) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pj, &sec);
        secp256k1_ge_set_gej(&p, &pj);
        secp256k1_pubkey_save(pubkey, &p);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}